

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  pointer pSVar10;
  pointer pSVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  SrcEvaluatorType srcEvaluator;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  SpatialVector Xa;
  Vector3d qdd_temp;
  SpatialVector local_108;
  VectorNd *local_d8;
  long local_d0;
  SpatialVector_t local_c8;
  long local_98;
  long local_90;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *local_88;
  Vector3_t local_80;
  long local_68;
  double local_58;
  double local_48;
  
  lVar14 = (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar14 != 0) {
    uVar15 = (lVar14 >> 4) * 0x6db6db6db6db6db7;
    lVar14 = *(long *)(CS + 0x268);
    lVar8 = *(long *)(CS + 0x280);
    lVar22 = *(long *)(CS + 0x298);
    lVar17 = *(long *)(CS + 0x2e8);
    uVar23 = 1;
    uVar16 = 0;
    do {
      lVar20 = uVar16 * 0x30;
      puVar1 = (undefined8 *)(lVar14 + 0x20 + lVar20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar14 + 0x10 + lVar20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar14 + lVar20) = 0;
      ((undefined8 *)(lVar14 + lVar20))[1] = 0;
      puVar1 = (undefined8 *)(lVar8 + 0x20 + lVar20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar8 + 0x10 + lVar20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar8 + lVar20) = 0;
      ((undefined8 *)(lVar8 + lVar20))[1] = 0;
      *(undefined8 *)(lVar22 + uVar16 * 8) = 0;
      *(undefined8 *)(lVar17 + 0x10 + uVar16 * 0x18) = 0;
      puVar1 = (undefined8 *)(lVar17 + uVar16 * 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar16 = (ulong)uVar23;
      uVar23 = uVar23 + 1;
    } while (uVar16 <= uVar15 && uVar15 - uVar16 != 0);
  }
  local_d8 = QDDot_t;
  local_88 = f_t;
  if (body_id != 0) {
    uVar15 = (ulong)body_id;
    lVar14 = uVar15 * 0x90;
    lVar8 = uVar15 * 0x30;
    lVar17 = uVar15 * 0x18;
    lVar22 = uVar15 * 0x60;
    local_98 = uVar15 * 0x48;
    lVar24 = 0;
    local_90 = uVar15 * 0x60;
    lVar20 = lVar8;
    uVar16 = uVar15;
    local_d0 = lVar17;
    do {
      uVar21 = uVar16 - 1;
      if (lVar24 == 0) {
        Math::SpatialTransform::applyAdjoint
                  (&local_108,
                   (SpatialTransform *)
                   ((long)&(((model->X_base).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                   local_90),
                   (local_88->
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar15);
        lVar17 = *(long *)(CS + 0x268);
        *(double *)(lVar17 + lVar8) =
             -local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
        ;
        ((double *)(lVar17 + lVar8))[1] =
             -local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
        ;
        pdVar2 = (double *)(lVar17 + 0x10 + lVar8);
        *pdVar2 = -local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
        pdVar2[1] = -local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[3];
        pdVar2 = (double *)(lVar17 + 0x20 + lVar8);
        *pdVar2 = -local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4];
        pdVar2[1] = -local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[5];
        lVar17 = local_d0;
      }
      if (*(int *)((long)&((model->mJoints).
                           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           ._M_impl.super__Vector_impl_data._M_start)->mDoFCount + lVar24 + lVar17)
          == 3) {
        local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((long)&(((model->multdof3_S).
                               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               .
                               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
                     + lVar14);
        local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)(*(long *)(CS + 0x268) + lVar20);
        Vector3_t::operator=
                  ((Vector3_t *)(*(long *)(CS + 0x2e8) + lVar17 + lVar24),
                   (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)&local_108);
        uVar16 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
        if (uVar16 != 0) {
          lVar9 = *(long *)(CS + 0x268);
          lVar19 = uVar16 * 0x30;
          pSVar10 = (model->X_lambda).
                    super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_80.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0] = (double)(lVar9 + lVar20);
          local_80.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1] =
               (double)((long)&(((model->multdof3_U).
                                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 .
                                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                               m_storage + lVar14);
          local_80.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2] =
               (double)((long)&(((model->multdof3_Dinv).
                                 super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                                 super__Vector_impl_data._M_start)->super_Matrix3d).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage + local_98);
          local_68 = *(long *)(CS + 0x2e8) + lVar17 + lVar24;
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    (&local_c8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)&local_80);
          Math::SpatialTransform::applyTranspose
                    ((SpatialTransform *)((long)&(pSVar10->E).super_Matrix3d + lVar22),&local_c8);
          lVar17 = *(long *)(CS + 0x268);
          dVar26 = ((double *)(lVar9 + lVar19))[1];
          *(double *)(lVar17 + lVar19) =
               *(double *)(lVar9 + lVar19) +
               local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
          ((double *)(lVar17 + lVar19))[1] =
               dVar26 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
          pdVar2 = (double *)(lVar9 + 0x10 + lVar19);
          dVar26 = pdVar2[1];
          pdVar3 = (double *)(lVar17 + 0x10 + lVar19);
          *pdVar3 = *pdVar2 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2];
          pdVar3[1] = dVar26 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3];
          pdVar2 = (double *)(lVar9 + 0x20 + lVar19);
          dVar26 = pdVar2[1];
          pdVar3 = (double *)(lVar17 + 0x20 + lVar19);
          *pdVar3 = *pdVar2 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[4];
          pdVar3[1] = dVar26 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5];
          lVar17 = local_d0;
        }
      }
      else {
        pSVar11 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)(CS + 0x268);
        lVar19 = lVar8 + lVar9;
        pdVar2 = (double *)
                 ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar24 * 2);
        pdVar4 = (double *)
                 ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar24 * 2 + 0x10);
        pdVar5 = (double *)
                 ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar24 * 2 + 0x20);
        pdVar3 = (double *)(lVar19 + lVar24 * 2);
        pdVar6 = (double *)(lVar19 + 0x10 + lVar24 * 2);
        pdVar7 = (double *)(lVar19 + 0x20 + lVar24 * 2);
        dVar26 = -(pdVar5[1] * pdVar7[1] + pdVar4[1] * pdVar6[1] + pdVar2[1] * pdVar3[1] +
                  *pdVar5 * *pdVar7 + *pdVar4 * *pdVar6 + *pdVar2 * *pdVar3);
        *(double *)(*(long *)(CS + 0x298) + 8 + uVar21 * 8) = dVar26;
        uVar18 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
        if (uVar18 != 0) {
          lVar17 = lVar8 + lVar9;
          lVar19 = uVar18 * 0x30;
          pSVar11 = (model->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_48 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[uVar16];
          pdVar2 = (double *)
                   ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar24 * 2
                   );
          auVar29._0_8_ = *pdVar2 * dVar26;
          auVar29._8_8_ = pdVar2[1] * dVar26;
          auVar30._8_8_ = local_48;
          auVar30._0_8_ = local_48;
          auVar30 = divpd(auVar29,auVar30);
          pdVar2 = (double *)(lVar17 + lVar24 * 2);
          local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               auVar30._0_8_ + *pdVar2;
          local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               auVar30._8_8_ + pdVar2[1];
          pdVar2 = (double *)
                   ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar24 * 2 + 0x10);
          auVar31._0_8_ = *pdVar2 * dVar26;
          auVar31._8_8_ = pdVar2[1] * dVar26;
          auVar12._8_8_ = local_48;
          auVar12._0_8_ = local_48;
          auVar30 = divpd(auVar31,auVar12);
          pdVar2 = (double *)(lVar17 + 0x10 + lVar24 * 2);
          local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               auVar30._0_8_ + *pdVar2;
          local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               auVar30._8_8_ + pdVar2[1];
          pdVar2 = (double *)
                   ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar24 * 2 + 0x20);
          auVar28._0_8_ = dVar26 * *pdVar2;
          auVar28._8_8_ = dVar26 * pdVar2[1];
          auVar13._8_8_ = local_48;
          auVar13._0_8_ = local_48;
          auVar30 = divpd(auVar28,auVar13);
          pdVar2 = (double *)(lVar17 + 0x20 + lVar24 * 2);
          local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               auVar30._0_8_ + *pdVar2;
          local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
               auVar30._8_8_ + pdVar2[1];
          local_58 = dVar26;
          Math::SpatialTransform::applyTranspose
                    ((SpatialTransform *)
                     ((long)&(((model->X_lambda).
                               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                               ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                     lVar22),&local_c8);
          lVar17 = *(long *)(CS + 0x268);
          dVar26 = ((double *)(lVar9 + lVar19))[1];
          *(double *)(lVar17 + lVar19) =
               *(double *)(lVar9 + lVar19) +
               local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
          ((double *)(lVar17 + lVar19))[1] =
               dVar26 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
          pdVar2 = (double *)(lVar9 + 0x10 + lVar19);
          dVar26 = pdVar2[1];
          pdVar3 = (double *)(lVar17 + 0x10 + lVar19);
          *pdVar3 = *pdVar2 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2];
          pdVar3[1] = dVar26 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3];
          pdVar2 = (double *)(lVar9 + 0x20 + lVar19);
          dVar26 = pdVar2[1];
          pdVar3 = (double *)(lVar17 + 0x20 + lVar19);
          *pdVar3 = *pdVar2 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[4];
          pdVar3[1] = dVar26 + local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5];
          lVar17 = local_d0;
        }
      }
      lVar14 = lVar14 + -0x90;
      lVar20 = lVar20 + -0x30;
      lVar24 = lVar24 + -0x18;
      lVar22 = lVar22 + -0x60;
      local_98 = local_98 + -0x48;
      uVar16 = uVar21;
    } while ((int)uVar21 != 0);
  }
  *(local_d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = 0.0
  ;
  pSVar11 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar1 = *(undefined8 **)(CS + 0x280);
  dVar26 = *(double *)
            ((long)&(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
  *puVar1 = *(undefined8 *)
             &(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
  puVar1[1] = dVar26;
  dVar26 = *(double *)
            ((long)&(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
  puVar1[2] = *(double *)
               ((long)&(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
  puVar1[3] = dVar26;
  dVar26 = *(double *)
            ((long)&(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
  puVar1[4] = *(double *)
               ((long)&(pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
  puVar1[5] = dVar26;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar15 = 1;
    uVar16 = 2;
    do {
      uVar23 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].q_index;
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar15,
                 (SpatialVector *)
                 ((ulong)(model->lambda).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar15] * 0x30 + *(long *)(CS + 0x280)));
      if ((model->mJoints).
          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          .
          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar15].mDoFCount == 3) {
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->multdof3_Dinv).
                      super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar15);
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)(uVar15 * 0x18 + *(long *)(CS + 0x2e8));
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)((model->multdof3_U).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15);
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             (double)&local_108;
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  (&local_80,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)&local_c8);
        pdVar2 = (local_d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar2[uVar23] =
             local_80.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        pdVar2[uVar23 + 1] =
             local_80.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
        pdVar2[uVar23 + 2] =
             local_80.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15);
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15);
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)&local_80;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)
                   local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                             *)&local_c8);
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15);
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)&local_108;
        local_c8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)&local_80;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)(uVar15 * 0x30 + *(long *)(CS + 0x280)),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)&local_c8);
      }
      else {
        lVar8 = uVar15 * 0x30;
        pSVar11 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar2 = (double *)
                 ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar3 = (double *)
                 ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar27 = (*(double *)(*(long *)(CS + 0x298) + uVar15 * 8) -
                 (pdVar3[1] *
                  local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] +
                  pdVar2[1] *
                  local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] +
                  *(double *)
                   ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                  local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                 *pdVar3 * local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[4] +
                 *pdVar2 * local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                 *(double *)
                  &pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                 local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0])) / (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[uVar15];
        (local_d8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar23] = dVar27;
        pSVar11 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar14 = *(long *)(CS + 0x280);
        dVar26 = *(double *)
                  ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)(lVar14 + lVar8) =
             *(double *)
              &pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar27 +
             local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
        ((double *)(lVar14 + lVar8))[1] =
             dVar26 * dVar27 +
             local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
        pdVar2 = (double *)
                 ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar26 = pdVar2[1];
        pdVar3 = (double *)(lVar14 + 0x10 + lVar8);
        *pdVar3 = *pdVar2 * dVar27 +
                  local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
        pdVar3[1] = dVar26 * dVar27 +
                    local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[3];
        pdVar2 = (double *)
                 ((long)&pSVar11[uVar15].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar26 = pdVar2[1];
        pdVar3 = (double *)(lVar14 + 0x20 + lVar8);
        *pdVar3 = dVar27 * *pdVar2 +
                  local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4];
        pdVar3[1] = dVar27 * dVar26 +
                    local_108.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5];
      }
      uVar15 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      bVar25 = uVar16 <= uVar15;
      lVar14 = uVar15 - uVar16;
      uVar15 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar25 && lVar14 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
		Model &model,
		ConstraintSet &CS,
		VectorNd &QDDot_t,
		const unsigned int body_id,
		const std::vector<SpatialVector> &f_t
		) {
	LOG << "-------- " << __func__ << " ------" << std::endl;

	assert (CS.d_pA.size() == model.mBodies.size());
	assert (CS.d_a.size() == model.mBodies.size());
	assert (CS.d_u.size() == model.mBodies.size());

	// TODO reset all values (debug)
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		CS.d_pA[i].setZero();
		CS.d_a[i].setZero();
		CS.d_u[i] = 0.;
		CS.d_multdof3_u[i].setZero();
	}

	for (unsigned int i = body_id; i > 0; i--) {
		if (i == body_id) {
			CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
		}

		if (model.mJoints[i].mDoFCount == 3) {
			CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.multdof3_U[i] * model.multdof3_Dinv[i] * CS.d_multdof3_u[i]);
			}
		} else {
			CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
			}
		}
	}

	for (unsigned int i = 0; i < f_t.size(); i++) {
		LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
	}

	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
	}
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
	}

	QDDot_t[0] = 0.;
	CS.d_a[0] = model.a[0];

	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		unsigned int q_index = model.mJoints[i].q_index;
		unsigned int lambda = model.lambda[i];

		SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

		if (model.mJoints[i].mDoFCount == 3) {
			Vector3d qdd_temp = model.multdof3_Dinv[i] * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);
			QDDot_t[q_index] = qdd_temp[0];
			QDDot_t[q_index + 1] = qdd_temp[1];
			QDDot_t[q_index + 2] = qdd_temp[2];
			model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
			CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
		} else {
			QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
			CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
		}
	
		LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
		LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
	}
}